

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::trytable<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  __index_type *__return_storage_ptr___00;
  optional<wasm::Name> label_00;
  bool bVar1;
  __optional_ne_t<wasm::Name,_wasm::Name> _Var2;
  size_t sVar3;
  CatchInfo *pCVar4;
  HeapType *pHVar5;
  Err *pEVar6;
  char cVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  Result<wasm::Ok> local_390;
  allocator<char> local_361;
  string local_360;
  Err local_340;
  undefined1 local_320 [8];
  optional<wasm::Name> id;
  string local_300;
  Err local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_2c0;
  allocator<char> local_2a9;
  string local_2a8;
  Err local_288;
  Err local_268;
  Err *local_248;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  Err *err_2;
  undefined1 local_1d0 [8];
  Result<wasm::Ok> _val_2;
  Err local_188;
  Err *local_168;
  Err *err_1;
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> _val_1;
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> c;
  vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  catches;
  Err local_f0;
  Err *local_d0;
  Err *err;
  undefined1 local_b8 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> type;
  optional<wasm::Name> label;
  Index local_30;
  size_t pos;
  bool folded_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *ctx_local;
  
  sVar3 = Lexer::getPos(&ctx->in);
  if (folded) {
    bVar8 = sv("try_table",9);
    bVar1 = Lexer::takeSExprStart(&ctx->in,bVar8);
    if (!bVar1) goto LAB_024d5d9e;
  }
  if (!folded) {
    bVar8 = sv("try_table",9);
    bVar1 = Lexer::takeKeyword(&ctx->in,bVar8);
    if (!bVar1) {
LAB_024d5d9e:
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),&ctx->in);
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20);
  blocktype<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)__return_storage_ptr___00,ctx);
  Result<wasm::HeapType>::Result
            ((Result<wasm::HeapType> *)local_b8,(Result<wasm::HeapType> *)__return_storage_ptr___00)
  ;
  local_d0 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)local_b8);
  bVar1 = local_d0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_f0,local_d0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_f0);
    wasm::Err::~Err(&local_f0);
  }
  Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)local_b8);
  if (bVar1) goto LAB_024d67b2;
  ParseDefsCtx::makeCatchList
            ((vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
              *)((long)&c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                + 0x20),ctx);
  do {
    catchinstr<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               + 0x20),ctx);
    bVar1 = wasm::MaybeResult::operator_cast_to_bool
                      ((MaybeResult *)
                       ((long)&_val_1.val.
                               super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       + 0x20));
    if (bVar1) {
      MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo>::MaybeResult
                ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)&err_1,
                 (MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 + 0x20));
      local_168 = MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo>::getErr
                            ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)&err_1);
      cVar7 = local_168 != (Err *)0x0;
      if ((bool)cVar7) {
        wasm::Err::Err(&local_188,local_168);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_188);
        wasm::Err::~Err(&local_188);
      }
      MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo>::~MaybeResult
                ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)&err_1);
      if (!(bool)cVar7) {
        pCVar4 = MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo>::operator*
                           ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)
                            ((long)&_val_1.val.
                                    super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                            + 0x20));
        _val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
             (pCVar4->tag).super_IString.str._M_len;
        ParseDefsCtx::appendCatch
                  (ctx,(vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                        *)((long)&c.val.
                                  super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          + 0x20),*pCVar4);
        cVar7 = '\0';
      }
    }
    else {
      cVar7 = '\x03';
    }
    MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo>::~MaybeResult
              ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               + 0x20));
  } while (cVar7 == '\0');
  if (cVar7 == '\x03') {
    local_30 = (Index)sVar3;
    pHVar5 = Result<wasm::HeapType>::operator*
                       ((Result<wasm::HeapType> *)
                        ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
    label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
         (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_len;
    label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
         type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_;
    label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_8_ =
         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str;
    ParseDefsCtx::makeTryTable
              ((Result<wasm::Ok> *)local_1d0,ctx,local_30,annotations,label_00,(HeapType)pHVar5->id,
               (vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                *)((long)&c.val.
                          super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  + 0x20));
    pEVar6 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_1d0);
    if (pEVar6 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar6);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_1d0);
    if (pEVar6 == (Err *)0x0) {
      instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)&err_3,ctx);
      local_248 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
      bVar1 = local_248 == (Err *)0x0;
      if (!bVar1) {
        wasm::Err::Err(&local_268,local_248);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_268);
        wasm::Err::~Err(&local_268);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
      if (bVar1) {
        if (folded) {
          bVar1 = Lexer::takeRParen(&ctx->in);
          if (bVar1) {
LAB_024d6737:
            ParseDefsCtx::visitEnd(&local_390,ctx);
            MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_390);
            Result<wasm::Ok>::~Result(&local_390);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,"expected \')\' at end of try_table",&local_2a9);
            Lexer::err(&local_288,&ctx->in,&local_2a8);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_288);
            wasm::Err::~Err(&local_288);
            std::__cxx11::string::~string((string *)&local_2a8);
            std::allocator<char>::~allocator(&local_2a9);
          }
        }
        else {
          local_2c0 = sv("end",3);
          bVar1 = Lexer::takeKeyword(&ctx->in,local_2c0);
          if (bVar1) {
            Lexer::takeID((optional<wasm::Name> *)local_320,&ctx->in);
            bVar1 = std::optional::operator_cast_to_bool((optional *)local_320);
            if ((!bVar1) ||
               (_Var2 = std::operator!=((optional<wasm::Name> *)local_320,
                                        (optional<wasm::Name> *)
                                        ((long)&type.val.
                                                super__Variant_base<wasm::HeapType,_wasm::Err>.
                                                super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> +
                                        0x20)), !_Var2)) goto LAB_024d6737;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_360,"end label does not match try_table label",&local_361);
            Lexer::err(&local_340,&ctx->in,&local_360);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_340);
            wasm::Err::~Err(&local_340);
            std::__cxx11::string::~string((string *)&local_360);
            std::allocator<char>::~allocator(&local_361);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_300,"expected \'end\' at end of try_table",
                       (allocator<char> *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>.field_0x17);
            Lexer::err(&local_2e0,&ctx->in,&local_300);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2e0);
            wasm::Err::~Err(&local_2e0);
            std::__cxx11::string::~string((string *)&local_300);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>.field_0x17);
          }
        }
      }
    }
  }
  std::
  vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ::~vector((vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
             *)((long)&c.val.
                       super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               + 0x20));
LAB_024d67b2:
  Result<wasm::HeapType>::~Result
            ((Result<wasm::HeapType> *)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
trytable(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("try_table"sv)) ||
      (!folded && !ctx.in.takeKeyword("try_table"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto catches = ctx.makeCatchList();
  while (auto c = catchinstr(ctx)) {
    CHECK_ERR(c);
    ctx.appendCatch(catches, *c);
  }

  CHECK_ERR(ctx.makeTryTable(pos, annotations, label, *type, catches));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of try_table");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of try_table");
    }

    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match try_table label");
    }
  }
  return ctx.visitEnd();
}